

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_nand_m68k
               (TCGContext_conflict2 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t bofs,
               uint32_t oprsz,uint32_t maxsz)

{
  if (aofs == bofs) {
    tcg_gen_gvec_2_m68k(tcg_ctx,dofs,aofs,oprsz,maxsz,&tcg_gen_gvec_not_m68k::g);
    return;
  }
  tcg_gen_gvec_3_m68k(tcg_ctx,dofs,aofs,bofs,oprsz,maxsz,&tcg_gen_gvec_nand_m68k::g);
  return;
}

Assistant:

void tcg_gen_gvec_nand(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                       uint32_t bofs, uint32_t oprsz, uint32_t maxsz)
{
    static const GVecGen3 g = {
        .fni8 = tcg_gen_nand_i64,
        .fniv = tcg_gen_nand_vec,
        .fno = gen_helper_gvec_nand,
        .prefer_i64 = TCG_TARGET_REG_BITS == 64,
    };

    if (aofs == bofs) {
        tcg_gen_gvec_not(tcg_ctx, vece, dofs, aofs, oprsz, maxsz);
    } else {
        tcg_gen_gvec_3(tcg_ctx, dofs, aofs, bofs, oprsz, maxsz, &g);
    }
}